

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

char * __thiscall llvm::DWARFDie::getName(DWARFDie *this,DINameKind Kind)

{
  bool bVar1;
  char *pcVar2;
  Attribute local_da;
  ArrayRef<llvm::dwarf::Attribute> local_d8;
  Optional<llvm::DWARFFormValue> local_c8;
  char *Name_1;
  initializer_list<llvm::dwarf::Attribute> local_80;
  ArrayRef<llvm::dwarf::Attribute> local_70;
  Optional<llvm::DWARFFormValue> local_60;
  undefined8 local_28;
  char *Name;
  DWARFDie *pDStack_18;
  DINameKind Kind_local;
  DWARFDie *this_local;
  
  Name._4_4_ = Kind;
  pDStack_18 = this;
  bVar1 = isValid(this);
  if ((bVar1) && (Name._4_4_ != None)) {
    if (Name._4_4_ == LinkageName) {
      Name_1._4_2_ = 0x2007;
      Name_1._6_2_ = 0x6e;
      local_80._M_array = (iterator)((long)&Name_1 + 4);
      local_80._M_len = 2;
      ArrayRef<llvm::dwarf::Attribute>::ArrayRef(&local_70,&local_80);
      findRecursively(&local_60,this,local_70);
      pcVar2 = dwarf::toString(&local_60,(char *)0x0);
      if (pcVar2 != (char *)0x0) {
        return pcVar2;
      }
      local_28 = 0;
    }
    local_da = DW_AT_name;
    ArrayRef<llvm::dwarf::Attribute>::ArrayRef(&local_d8,&local_da);
    findRecursively(&local_c8,this,local_d8);
    this_local = (DWARFDie *)dwarf::toString(&local_c8,(char *)0x0);
    if (this_local == (DWARFDie *)0x0) {
      this_local = (DWARFDie *)0x0;
    }
  }
  else {
    this_local = (DWARFDie *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char *DWARFDie::getName(DINameKind Kind) const {
  if (!isValid() || Kind == DINameKind::None)
    return nullptr;
  // Try to get mangled name only if it was asked for.
  if (Kind == DINameKind::LinkageName) {
    if (auto Name = dwarf::toString(
            findRecursively({DW_AT_MIPS_linkage_name, DW_AT_linkage_name}),
            nullptr))
      return Name;
  }
  if (auto Name = dwarf::toString(findRecursively(DW_AT_name), nullptr))
    return Name;
  return nullptr;
}